

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

void __thiscall
duckdb::
PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>::
PrimitiveDictionary(PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                    *this,Allocator *allocator_p,idx_t maximum_size_p,
                   idx_t maximum_target_capacity_p)

{
  Allocator *pAVar1;
  primitive_dictionary_entry_t *ppVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  data_ptr_t pdVar5;
  uint32_t *puVar6;
  ulong uVar7;
  long lVar8;
  idx_t iVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  uVar4 = NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = uVar4;
  this->capacity_mask = uVar4 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  pAVar1 = this->allocator;
  pdVar5 = Allocator::AllocateData(pAVar1,uVar4 * 0x18);
  AllocatedData::AllocatedData(&this->allocated_dictionary,pAVar1,pdVar5,uVar4 * 0x18);
  pAVar1 = this->allocator;
  iVar9 = this->capacity << 4;
  pdVar5 = Allocator::AllocateData(pAVar1,iVar9);
  AllocatedData::AllocatedData(&this->allocated_target,pAVar1,pdVar5,iVar9);
  MemoryStream::MemoryStream
            (&this->target_stream,(this->allocated_target).pointer,
             (this->allocated_target).allocated_size);
  iVar9 = this->capacity;
  ppVar2 = (primitive_dictionary_entry_t *)(this->allocated_dictionary).pointer;
  this->dictionary = ppVar2;
  this->full = false;
  auVar3 = _DAT_01352200;
  if (iVar9 != 0) {
    uVar7 = iVar9 + 3 & 0xfffffffffffffffc;
    lVar8 = iVar9 - 1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    puVar6 = &ppVar2[3].index;
    auVar10 = auVar10 ^ _DAT_01352200;
    auVar12 = _DAT_0135a330;
    auVar13 = _DAT_0135a310;
    do {
      auVar14 = auVar13 ^ auVar3;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_ ||
                  iVar11 < auVar14._4_4_) & 1)) {
        puVar6[-0x12] = 0xffffffff;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        puVar6[-0xc] = 0xffffffff;
      }
      auVar14 = auVar12 ^ auVar3;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar14._0_4_ <= auVar10._0_4_)) {
        puVar6[-6] = 0xffffffff;
        *puVar6 = 0xffffffff;
      }
      lVar8 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar8 + 4;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar8 + 4;
      puVar6 = puVar6 + 0x18;
      uVar7 = uVar7 - 4;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}